

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_read_block(BGZF *fp)

{
  undefined8 *puVar1;
  int iVar2;
  ssize_t sVar3;
  off_t block_address_00;
  z_stream *pzVar4;
  bool bVar5;
  int local_6c;
  int ret_1;
  int nskip;
  uint8_t *cblock;
  int ret;
  int64_t block_address;
  int remaining;
  int block_length;
  int size;
  int count;
  uint8_t *compressed_block;
  uint8_t header [18];
  BGZF *fp_local;
  
  if ((*(int *)fp << 1) >> 0x1e == 0) {
    sVar3 = hread(fp->fp,fp->uncompressed_block,0x10000);
    iVar2 = (int)sVar3;
    if (iVar2 == 0) {
      fp->block_length = 0;
      fp_local._4_4_ = 0;
    }
    else {
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = (long)iVar2 + fp->block_address;
      fp->block_length = iVar2;
      fp_local._4_4_ = 0;
    }
  }
  else {
    block_address_00 = htell(fp->fp);
    if ((*(int *)fp < 0) && (fp->gz_stream != (z_stream *)0x0)) {
      iVar2 = inflate_gzip_block(fp,0);
      if (iVar2 < 0) {
        *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
        fp_local._4_4_ = -1;
      }
      else {
        fp->block_length = iVar2;
        fp->block_address = block_address_00;
        fp_local._4_4_ = 0;
      }
    }
    else if ((fp->cache_size == 0) ||
            (iVar2 = load_block_from_cache(fp,block_address_00), iVar2 == 0)) {
      sVar3 = hread(fp->fp,&compressed_block,0x12);
      if ((int)sVar3 == 0) {
        fp->block_length = 0;
        fp_local._4_4_ = 0;
      }
      else if (((int)sVar3 == 0x12) &&
              (iVar2 = check_header((uint8_t *)&compressed_block), iVar2 != -2)) {
        if (iVar2 == -1) {
          puVar1 = (undefined8 *)fp->compressed_block;
          *puVar1 = CONCAT44(compressed_block._4_4_,(uint)compressed_block);
          puVar1[1] = header._0_8_;
          *(undefined2 *)(puVar1 + 2) = header._8_2_;
          sVar3 = hread(fp->fp,(void *)((long)puVar1 + 0x12),0xfeee);
          local_6c = 10;
          if (((uint)compressed_block & 0x4000000) != 0) {
            local_6c = unpackInt16((uint8_t *)((long)puVar1 + 10));
            local_6c = local_6c + 0xc;
          }
          if ((compressed_block._3_1_ & 8) != 0) {
            while( true ) {
              bVar5 = false;
              if (local_6c < 0xff00) {
                bVar5 = *(char *)((long)puVar1 + (long)local_6c) != '\0';
              }
              if (!bVar5) break;
              local_6c = local_6c + 1;
            }
            if (local_6c == 0xff00) {
              *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 2;
              return -1;
            }
            local_6c = local_6c + 1;
          }
          if ((compressed_block._3_1_ & 0x10) != 0) {
            while( true ) {
              bVar5 = false;
              if (local_6c < 0xff00) {
                bVar5 = *(char *)((long)puVar1 + (long)local_6c) != '\0';
              }
              if (!bVar5) break;
              local_6c = local_6c + 1;
            }
            if (local_6c == 0xff00) {
              *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 2;
              return -1;
            }
            local_6c = local_6c + 1;
          }
          if ((compressed_block._3_1_ & 2) != 0) {
            local_6c = local_6c + 2;
          }
          *(uint *)fp = *(uint *)fp & 0x7fffffff | 0x80000000;
          pzVar4 = (z_stream *)calloc(1,0x70);
          fp->gz_stream = pzVar4;
          iVar2 = inflateInit2_(fp->gz_stream,0xfffffff1,"1.2.11",0x70);
          if (iVar2 == 0) {
            fp->gz_stream->avail_in = ((int)sVar3 + 0x12) - local_6c;
            fp->gz_stream->next_in = (Bytef *)((long)puVar1 + (long)local_6c);
            iVar2 = inflate_gzip_block(fp,1);
            if (iVar2 < 0) {
              *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
              fp_local._4_4_ = -1;
            }
            else {
              fp->block_length = iVar2;
              fp->block_address = block_address_00;
              if (fp->idx_build_otf == 0) {
                fp_local._4_4_ = 0;
              }
              else {
                fp_local._4_4_ = -1;
              }
            }
          }
          else {
            *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
            fp_local._4_4_ = -1;
          }
        }
        else {
          iVar2 = unpackInt16(header + 8);
          puVar1 = (undefined8 *)fp->compressed_block;
          *puVar1 = CONCAT44(compressed_block._4_4_,(uint)compressed_block);
          puVar1[1] = header._0_8_;
          *(undefined2 *)(puVar1 + 2) = header._8_2_;
          sVar3 = hread(fp->fp,(void *)((long)puVar1 + 0x12),(long)(iVar2 + -0x11));
          if ((int)sVar3 == iVar2 + -0x11) {
            iVar2 = inflate_block(fp,iVar2 + 1);
            if (iVar2 < 0) {
              fp_local._4_4_ = -1;
            }
            else {
              if (fp->block_length != 0) {
                fp->block_offset = 0;
              }
              fp->block_address = block_address_00;
              fp->block_length = iVar2;
              if (fp->idx_build_otf != 0) {
                bgzf_index_add_block(fp);
                fp->idx->ublock_addr = (long)iVar2 + fp->idx->ublock_addr;
              }
              cache_block(fp,(int)sVar3 + 0x12);
              fp_local._4_4_ = 0;
            }
          }
          else {
            *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
            fp_local._4_4_ = -1;
          }
        }
      }
      else {
        *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 2;
        fp_local._4_4_ = -1;
      }
    }
    else {
      fp_local._4_4_ = 0;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_read_block(BGZF *fp)
{
    uint8_t header[BLOCK_HEADER_LENGTH], *compressed_block;
    int count, size = 0, block_length, remaining;

    // Reading an uncompressed file
    if ( !fp->is_compressed )
    {
        count = hread(fp->fp, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
        if ( count==0 )
        {
            fp->block_length = 0;
            return 0;
        }
        if (fp->block_length != 0) fp->block_offset = 0;
        fp->block_address += count;
        fp->block_length = count;
        return 0;
    }

    // Reading compressed file
    int64_t block_address;
    block_address = htell(fp->fp);
    if ( fp->is_gzip && fp->gz_stream ) // is this is a initialized gzip stream?
    {
        count = inflate_gzip_block(fp, 0);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        return 0;
    }
    if (fp->cache_size && load_block_from_cache(fp, block_address)) return 0;
    count = hread(fp->fp, header, sizeof(header));
    if (count == 0) { // no data read
        fp->block_length = 0;
        return 0;
    }
    int ret;
    if ( count != sizeof(header) || (ret=check_header(header))==-2 )
    {
        fp->errcode |= BGZF_ERR_HEADER;
        return -1;
    }
    if ( ret==-1 )
    {
        // GZIP, not BGZF
        uint8_t *cblock = (uint8_t*)fp->compressed_block;
        memcpy(cblock, header, sizeof(header));
        count = hread(fp->fp, cblock+sizeof(header), BGZF_BLOCK_SIZE - sizeof(header)) + sizeof(header);
        int nskip = 10;

        // Check optional fields to skip: FLG.FNAME,FLG.FCOMMENT,FLG.FHCRC,FLG.FEXTRA
        // Note: Some of these fields are untested, I did not have appropriate data available
        if ( header[3] & 0x4 ) // FLG.FEXTRA
        {
            nskip += unpackInt16(&cblock[nskip]) + 2;
        }
        if ( header[3] & 0x8 ) // FLG.FNAME
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x10 ) // FLG.FCOMMENT
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x2 ) nskip += 2;  //  FLG.FHCRC

        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*) calloc(1,sizeof(z_stream));
        int ret = inflateInit2(fp->gz_stream, -15);
        if (ret != Z_OK)
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->gz_stream->avail_in = count - nskip;
        fp->gz_stream->next_in  = cblock + nskip;
        count = inflate_gzip_block(fp, 1);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        if ( fp->idx_build_otf ) return -1; // cannot build index for gzip
        return 0;
    }
    size = count;
    block_length = unpackInt16((uint8_t*)&header[16]) + 1; // +1 because when writing this number, we used "-1"
    compressed_block = (uint8_t*)fp->compressed_block;
    memcpy(compressed_block, header, BLOCK_HEADER_LENGTH);
    remaining = block_length - BLOCK_HEADER_LENGTH;
    count = hread(fp->fp, &compressed_block[BLOCK_HEADER_LENGTH], remaining);
    if (count != remaining) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    size += count;
    if ((count = inflate_block(fp, block_length)) < 0) return -1;
    if (fp->block_length != 0) fp->block_offset = 0; // Do not reset offset if this read follows a seek.
    fp->block_address = block_address;
    fp->block_length = count;
    if ( fp->idx_build_otf )
    {
        bgzf_index_add_block(fp);
        fp->idx->ublock_addr += count;
    }
    cache_block(fp, size);
    return 0;
}